

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O1

bool __thiscall
ProjectBuilderMakefileGenerator::replaceLibrarySuffix
          (ProjectBuilderMakefileGenerator *this,QString *lib_file,ProString *opt,QString *name,
          QString *library)

{
  char16_t *pcVar1;
  QString *pQVar2;
  QMakeProject *pQVar3;
  QString file;
  undefined8 uVar4;
  Data *pDVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  const_iterator cVar9;
  ProStringList *pPVar10;
  QList<ProString> *this_00;
  iterator other;
  Data *pDVar11;
  SourceFiles *pSVar12;
  long in_FS_OFFSET;
  bool bVar13;
  QByteArrayView QVar14;
  QStringView config;
  QArrayData *in_stack_fffffffffffffea8;
  QArrayData *pQVar15;
  QArrayData *pQVar16;
  char16_t *pcStack_150;
  undefined1 local_128 [64];
  Data local_e8;
  char16_t *local_c0;
  QArrayData *local_b8;
  undefined1 *puStack_b0;
  QHash<QString,_bool> local_a8;
  ProKey local_a0;
  QMap<ProKey,_ProStringList> local_70;
  ProString local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((lib_file->d).size == 0) {
    bVar13 = false;
  }
  else {
    local_70.d.d.ptr =
         (QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
          )(totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
            )0x0;
    bVar6 = QMakeMetaInfo::readLib((QMakeMetaInfo *)&local_70,lib_file);
    bVar13 = true;
    if (((bVar6) &&
        (ProKey::ProKey(&local_a0,"QMAKE_PRL_TARGET"),
        local_70.d.d.ptr !=
        (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
         )0x0)) &&
       (cVar9 = std::
                _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                        *)((long)local_70.d.d.ptr + 8),&local_a0),
       cVar9._M_node != (_Base_ptr)((long)local_70.d.d.ptr + 0x10))) {
      pPVar10 = QMap<ProKey,_ProStringList>::operator[](&local_70,&local_a0);
      bVar13 = (pPVar10->super_QList<ProString>).d.size == 0;
    }
    if ((bVar6) && (&(local_a0.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0)
       ) {
      LOCK();
      ((local_a0.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_a0.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a0.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a0.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (bVar13 == false) {
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_e8.seed = (size_t)(lib_file->d).d;
      local_e8.spans = (Span *)(lib_file->d).ptr;
      local_c0 = (char16_t *)(lib_file->d).size;
      if ((QArrayData *)local_e8.seed != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((QArrayData *)local_e8.seed)->ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((QArrayData *)local_e8.seed)->ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      file.d.ptr = (char16_t *)name;
      file.d.d = (Data *)this;
      file.d.size = (qsizetype)in_stack_fffffffffffffea8;
      MakefileGenerator::fileInfo((MakefileGenerator *)local_128,file);
      QFileInfo::absolutePath();
      QFileInfo::~QFileInfo((QFileInfo *)local_128);
      if ((QArrayData *)local_e8.seed != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8.seed)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8.seed)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8.seed)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8.seed,2,0x10);
        }
      }
      ProKey::ProKey((ProKey *)&stack0xfffffffffffffea8,"QMAKE_PRL_TARGET");
      if (((local_70.d.d.ptr ==
            (totally_ordered_wrapper<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_*>
             )0x0) ||
          (cVar9 = std::
                   _Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                   ::find((_Rb_tree<ProKey,_std::pair<const_ProKey,_ProStringList>,_std::_Select1st<std::pair<const_ProKey,_ProStringList>_>,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>
                           *)((long)local_70.d.d.ptr + 8),(key_type *)&stack0xfffffffffffffea8),
          cVar9._M_node == (_Base_ptr)((long)local_70.d.d.ptr + 0x10))) ||
         (pPVar10 = QMap<ProKey,_ProStringList>::operator[]
                              (&local_70,(ProKey *)&stack0xfffffffffffffea8),
         (pPVar10->super_QList<ProString>).d.size == 0)) {
        ProString::ProString(&local_68,"");
      }
      else {
        this_00 = &QMap<ProKey,_ProStringList>::operator[]
                             (&local_70,(ProKey *)&stack0xfffffffffffffea8)->super_QList<ProString>;
        other = QList<ProString>::begin(this_00);
        ProString::ProString(&local_68,other.i);
      }
      local_128._0_8_ = &local_b8;
      local_128._8_8_ = &Option::dir_sep;
      ProString::ProString((ProString *)(local_128 + 0x10),&local_68);
      QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString>::convertTo<QString>
                ((QString *)&local_e8,
                 (QStringBuilder<QStringBuilder<const_QString_&,_QString_&>,_ProString> *)local_128)
      ;
      pQVar15 = &((library->d).d)->super_QArrayData;
      pcVar1 = (library->d).ptr;
      (library->d).d = (Data *)local_e8._0_8_;
      (library->d).ptr = (char16_t *)local_e8.size;
      pQVar2 = (QString *)(library->d).size;
      (library->d).size = local_e8.numBuckets;
      local_e8._0_8_ = pQVar15;
      local_e8.size = (size_t)pcVar1;
      local_e8.numBuckets = (size_t)pQVar2;
      if (pQVar15 != (QArrayData *)0x0) {
        LOCK();
        (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar15,2,0x10);
        }
      }
      if ((QArrayData *)local_128._16_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_128._16_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_128._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_128._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_128._16_8_,2,0x10);
        }
      }
      if ((Data *)local_68.m_string.d.d != (Data *)0x0) {
        LOCK();
        ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (in_stack_fffffffffffffea8 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffea8->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffea8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((in_stack_fffffffffffffea8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(in_stack_fffffffffffffea8,2,0x10);
        }
      }
      if (Option::debug_level != 0) {
        ProString::toLatin1((QByteArray *)local_128,opt);
        pSVar12 = (SourceFiles *)local_128._8_8_;
        if ((SourceFiles *)local_128._8_8_ == (SourceFiles *)0x0) {
          pSVar12 = (SourceFiles *)&QByteArray::_empty;
        }
        QString::toLatin1_helper((QString *)&local_68);
        pDVar11 = (Data *)local_68.m_string.d.ptr;
        if ((Data *)local_68.m_string.d.ptr == (Data *)0x0) {
          pDVar11 = (Data *)&QByteArray::_empty;
        }
        QString::toLatin1_helper((QString *)&stack0xfffffffffffffea8);
        if (pcStack_150 == (char16_t *)0x0) {
          pcStack_150 = (char16_t *)&QByteArray::_empty;
        }
        debug_msg_internal(1,"pbuilder: Found library (%s) via PRL %s (%s)",pSVar12,pDVar11,
                           pcStack_150);
        if (in_stack_fffffffffffffea8 != (QArrayData *)0x0) {
          LOCK();
          (in_stack_fffffffffffffea8->ref_)._q_value.super___atomic_base<int>._M_i =
               (in_stack_fffffffffffffea8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((in_stack_fffffffffffffea8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(in_stack_fffffffffffffea8,1,0x10);
          }
        }
        if ((Data *)local_68.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,1,0x10);
          }
        }
        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,1,0x10);
          }
        }
      }
      pQVar3 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
      QVar14.m_data = (storage_type *)0x1c;
      QVar14.m_size = (qsizetype)local_128;
      QString::fromUtf8(QVar14);
      uVar4 = local_128._0_8_;
      config.m_data = (storage_type_conflict *)local_128._8_8_;
      config.m_size = local_128._16_8_;
      bVar6 = QMakeEvaluator::isActiveConfig(&pQVar3->super_QMakeEvaluator,config,false);
      if ((QArrayData *)uVar4 != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)uVar4)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)uVar4)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)uVar4)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)uVar4,2,0x10);
        }
      }
      if (bVar6) {
        pQVar15 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_XCODE_LIBRARY_SUFFIX_SETTING");
        QMakeEvaluator::first
                  ((ProString *)local_128,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_68);
        ProString::toQString((QString *)&stack0xfffffffffffffea8,(ProString *)local_128);
        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
          }
        }
        if ((Data *)local_68.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_e8.numBuckets = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_e8.size = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        pQVar3 = (this->super_UnixMakefileGenerator).super_MakefileGenerator.project;
        ProKey::ProKey((ProKey *)&local_68,"QMAKE_XCODE_LIBRARY_SUFFIX");
        QMakeEvaluator::first
                  ((ProString *)local_128,&pQVar3->super_QMakeEvaluator,(ProKey *)&local_68);
        ProString::toQString((QString *)&local_e8,(ProString *)local_128);
        if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
          }
        }
        if ((Data *)local_68.m_string.d.d != (Data *)0x0) {
          LOCK();
          ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_68.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_68.m_string.d.d = (Data *)0x2a670a;
        local_68.m_string.d.size = 0x2aabab;
        local_68.m_string.d.ptr = (char16_t *)&stack0xfffffffffffffea8;
        QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>::
        convertTo<QString>((QString *)local_128,
                           (QStringBuilder<QStringBuilder<const_char_(&)[3],_QString_&>,_const_char_(&)[2]>
                            *)&local_68);
        pSVar12 = (SourceFiles *)local_128._8_8_;
        local_128._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_128._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        pQVar16 = (QArrayData *)local_128._0_8_;
        if (pQVar15 != (QArrayData *)0x0) {
          LOCK();
          (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            local_128._0_8_ = pQVar15;
            QArrayData::deallocate(pQVar15,2,0x10);
            pQVar15 = (QArrayData *)local_128._0_8_;
          }
        }
        local_128._0_8_ = pQVar15;
        if ((QString *)local_e8.numBuckets == (QString *)0x0) {
          iVar8 = QString::lastIndexOf
                            ((QString *)library,(longlong)name,(CaseSensitivity)(library->d).size);
          if (iVar8 != -1) {
            if (pSVar12 == (SourceFiles *)0x0) {
              pSVar12 = (SourceFiles *)&QString::_empty;
            }
            QString::insert((longlong)library,(QChar *)((long)iVar8 + (name->d).size),
                            (longlong)pSVar12);
          }
        }
        else {
          local_68.m_string.d.ptr = (char16_t *)CONCAT71(local_68.m_string.d.ptr._1_7_,0x2e);
          local_68.m_string.d.d = (Data *)&local_e8;
          QStringBuilder<QString_&,_char>::convertTo<QString>
                    ((QString *)local_128,(QStringBuilder<QString_&,_char> *)&local_68);
          iVar8 = QString::lastIndexOf
                            ((QString *)library,(longlong)local_128,
                             (CaseSensitivity)(library->d).size);
          if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_128._0_8_,2,0x10);
            }
          }
          if (iVar8 == -1) {
            QString::toLocal8Bit_helper((QChar *)local_128,local_e8.size);
            pSVar12 = (SourceFiles *)local_128._8_8_;
            if ((SourceFiles *)local_128._8_8_ == (SourceFiles *)0x0) {
              pSVar12 = (SourceFiles *)&QByteArray::_empty;
            }
            QString::toLocal8Bit_helper((QChar *)&local_68,(longlong)(library->d).ptr);
            pDVar11 = (Data *)local_68.m_string.d.ptr;
            if ((Data *)local_68.m_string.d.ptr == (Data *)0x0) {
              pDVar11 = (Data *)&QByteArray::_empty;
            }
            warn_msg(WarnLogic,"Failed to find expected suffix \'%s\' for library \'%s\'.",pSVar12,
                     pDVar11);
            pDVar5 = local_68.m_string.d.d;
            if ((Data *)local_68.m_string.d.d != (Data *)0x0) {
              LOCK();
              *(int *)&((DataPointer *)&(local_68.m_string.d.d)->super_QArrayData)->d =
                   *(int *)&((DataPointer *)&(local_68.m_string.d.d)->super_QArrayData)->d + -1;
              UNLOCK();
              if (*(int *)&((DataPointer *)&pDVar5->super_QArrayData)->d == 0) {
                QArrayData::deallocate(&(local_68.m_string.d.d)->super_QArrayData,1,0x10);
              }
            }
            if ((QArrayData *)local_128._0_8_ != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_128._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_128._0_8_,1,0x10);
              }
            }
          }
          else {
            QString::replace((longlong)library,(long)iVar8,(QString *)local_e8.numBuckets);
            cVar7 = QString::endsWith((QString *)name,(CaseSensitivity)&local_e8);
            if (cVar7 != '\0') {
              QString::chop((longlong)name);
            }
          }
        }
        if ((QArrayData *)local_e8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8._0_8_,2,0x10);
          }
        }
        if (pQVar16 != (QArrayData *)0x0) {
          LOCK();
          (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar16,2,0x10);
          }
        }
      }
      if (local_b8 != (QArrayData *)0x0) {
        LOCK();
        (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b8,2,0x10);
        }
      }
    }
    bVar13 = (bool)(bVar13 ^ 1);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_70.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar13;
}

Assistant:

bool ProjectBuilderMakefileGenerator::replaceLibrarySuffix(const QString &lib_file,
                                                           const ProString &opt,
                                                           QString &name, QString &library)
{
    /* This isn't real nice, but it is real useful. This looks in a prl
       for what the library will ultimately be called so we can stick it
       in the ProjectFile. If the prl format ever changes (not likely) then
       this will not really work. However, more concerning is that it will
       encode the version number in the Project file which might be a bad
       things in days to come? --Sam
    */
    if (lib_file.isEmpty())
        return false;

    QMakeMetaInfo libinfo;
    if (!libinfo.readLib(lib_file) || libinfo.isEmpty("QMAKE_PRL_TARGET"))
        return false;

    const QString libDir = fileInfo(lib_file).absolutePath();
    library = libDir + Option::dir_sep + libinfo.first("QMAKE_PRL_TARGET");

    debug_msg(1, "pbuilder: Found library (%s) via PRL %s (%s)",
              opt.toLatin1().constData(), lib_file.toLatin1().constData(), library.toLatin1().constData());

    if (project->isActiveConfig("xcode_dynamic_library_suffix")) {
        QString suffixSetting = project->first("QMAKE_XCODE_LIBRARY_SUFFIX_SETTING").toQString();
        if (!suffixSetting.isEmpty()) {
            QString librarySuffix = project->first("QMAKE_XCODE_LIBRARY_SUFFIX").toQString();
            suffixSetting = "$(" + suffixSetting + ")";
            if (!librarySuffix.isEmpty()) {
                int pos = library.lastIndexOf(librarySuffix + '.');
                if (pos == -1) {
                    warn_msg(WarnLogic, "Failed to find expected suffix '%s' for library '%s'.",
                             qPrintable(librarySuffix), qPrintable(library));
                } else {
                    library.replace(pos, librarySuffix.size(), suffixSetting);
                    if (name.endsWith(librarySuffix))
                        name.chop(librarySuffix.size());
                }
            } else {
                int pos = library.lastIndexOf(name);
                if (pos != -1)
                    library.insert(pos + name.size(), suffixSetting);
            }
        }
    }

    return true;
}